

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[27],unsigned_long,char[19],unsigned_long,char[84]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [27],unsigned_long *RestArgs,char (*RestArgs_1) [19],
               unsigned_long *RestArgs_2,char (*RestArgs_3) [84])

{
  char (*RestArgs_local_3) [84];
  unsigned_long *RestArgs_local_2;
  char (*RestArgs_local_1) [19];
  unsigned_long *RestArgs_local;
  char (*FirstArg_local) [27];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[27]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_long,char[19],unsigned_long,char[84]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}